

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::generate_training_example
               (search_private *priv,polylabel *losses,float weight,bool add_conditioning,
               float min_loss)

{
  example *peVar1;
  size_t sVar2;
  size_t sVar3;
  wclass *pwVar4;
  size_t sVar5;
  int iVar6;
  single_learner *this;
  wclass *pwVar7;
  multi_learner *this_00;
  ulong uVar8;
  size_t i;
  long lVar9;
  ulong uVar10;
  action a;
  ulong uVar11;
  ulong uVar12;
  size_t is_local;
  uint uVar13;
  bool bVar14;
  uint64_t local_80;
  wclass local_78;
  multi_ex tmp;
  
  if (priv->cb_learner == true) {
    if ((min_loss == 3.4028235e+38) && (!NAN(min_loss))) {
      pwVar7 = (losses->cs).costs._begin;
      lVar9 = (long)(losses->cs).costs._end - (long)pwVar7 >> 4;
      min_loss = 3.4028235e+38;
      while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
        if (pwVar7->x <= min_loss) {
          min_loss = pwVar7->x;
        }
        pwVar7 = pwVar7 + 1;
      }
    }
    lVar9 = 0;
    for (uVar10 = 0; pwVar7 = (losses->cs).costs._begin,
        uVar10 < (ulong)((long)(losses->cs).costs._end - (long)pwVar7 >> 4); uVar10 = uVar10 + 1) {
      *(float *)((long)&pwVar7->x + lVar9) = *(float *)((long)&pwVar7->x + lVar9) - min_loss;
      lVar9 = lVar9 + 0x10;
    }
  }
  else {
    if ((min_loss == 3.4028235e+38) && (!NAN(min_loss))) {
      pwVar7 = (losses->cs).costs._begin;
      lVar9 = (long)(losses->cs).costs._end - (long)pwVar7 >> 4;
      min_loss = 3.4028235e+38;
      while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
        if (pwVar7->x <= min_loss) {
          min_loss = pwVar7->x;
        }
        pwVar7 = pwVar7 + 1;
      }
    }
    lVar9 = 0;
    for (uVar10 = 0; pwVar7 = (losses->cs).costs._begin,
        uVar10 < (ulong)((long)(losses->cs).costs._end - (long)pwVar7 >> 4); uVar10 = uVar10 + 1) {
      *(float *)((long)&pwVar7->x + lVar9) =
           (*(float *)((long)&pwVar7->x + lVar9) - min_loss) * weight;
      lVar9 = lVar9 + 0x10;
    }
  }
  peVar1 = priv->learn_ec_ref;
  if (priv->is_ldf == false) {
    sVar2 = (peVar1->l).cb_eval.event.costs.erase_count;
    tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(peVar1->l).cs.costs._begin;
    tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(peVar1->l).cs.costs._end;
    tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(peVar1->l).cs.costs.end_array;
    sVar3 = (peVar1->l).cs.costs.erase_count;
    pwVar7 = (losses->cs).costs._end;
    pwVar4 = (losses->cs).costs.end_array;
    sVar5 = (losses->cs).costs.erase_count;
    (peVar1->l).multi = losses->multi;
    (peVar1->l).cs.costs._end = pwVar7;
    (peVar1->l).cs.costs.end_array = pwVar4;
    (peVar1->l).cs.costs.erase_count = sVar5;
    (peVar1->l).cb_eval.event.costs.erase_count = (losses->cb_eval).event.costs.erase_count;
    if (add_conditioning) {
      add_example_conditioning
                (priv,peVar1,
                 (long)(priv->learn_condition_on)._end - (long)(priv->learn_condition_on)._begin >>
                 2,(priv->learn_condition_on_names)._begin,(priv->learn_condition_on_act)._begin);
    }
    for (uVar10 = 0; uVar10 <= priv->xv; uVar10 = uVar10 + 1) {
      iVar6 = select_learner(priv,priv->current_policy,priv->learn_learner_id,true,uVar10 != 0);
      peVar1->in_use = true;
      this = LEARNER::as_singleline<char,char>(priv->base_learner);
      LEARNER::learner<char,_example>::learn(this,peVar1,(long)iVar6);
    }
    if (add_conditioning) {
      del_example_conditioning(priv,peVar1);
    }
    (peVar1->l).cb_eval.event.costs.erase_count = sVar2;
    (peVar1->l).cs.costs.end_array =
         (wclass *)
         tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (peVar1->l).cs.costs.erase_count = sVar3;
    (peVar1->l).cs.costs._begin =
         (wclass *)
         tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (peVar1->l).cs.costs._end =
         (wclass *)
         tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    priv->total_examples_generated = priv->total_examples_generated + 1;
  }
  else {
    bVar14 = COST_SENSITIVE::ec_is_example_header(peVar1);
    uVar11 = (ulong)bVar14;
    uVar10 = uVar11;
    if (add_conditioning) {
      for (; uVar10 < priv->learn_ec_ref_cnt; uVar10 = (ulong)((int)uVar10 + 1)) {
        add_example_conditioning
                  (priv,priv->learn_ec_ref + uVar10,
                   (long)(priv->learn_condition_on)._end - (long)(priv->learn_condition_on)._begin
                   >> 2,(priv->learn_condition_on_names)._begin,
                   (priv->learn_condition_on_act)._begin);
      }
    }
    for (uVar10 = 0; uVar10 <= priv->xv; uVar10 = uVar10 + 1) {
      iVar6 = select_learner(priv,priv->current_policy,priv->learn_learner_id,true,uVar10 != 0);
      tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      tmp.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uVar8 = priv->learn_ec_ref_cnt;
      if (uVar11 < uVar8) {
        local_80 = priv->learn_ec_ref[uVar11].super_example_predict.ft_offset;
      }
      else {
        local_80 = 0;
      }
      for (uVar13 = 0; uVar12 = (ulong)(uVar13 + bVar14), uVar12 < uVar8; uVar13 = uVar13 + 1) {
        peVar1 = priv->learn_ec_ref;
        pwVar7 = peVar1[uVar12].l.cs.costs._begin;
        if (peVar1[uVar12].l.cs.costs._end == pwVar7) {
          local_78._0_8_ = (ulong)uVar13 << 0x20;
          local_78.partial_prediction = 0.0;
          local_78.wap_value = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back
                    ((v_array<COST_SENSITIVE::wclass> *)&peVar1[uVar12].l.simple,&local_78);
          pwVar7 = peVar1[uVar12].l.cs.costs._begin;
        }
        local_78._0_8_ = peVar1 + uVar12;
        pwVar7->x = (losses->cs).costs._begin[uVar12 - uVar11].x;
        ((example *)local_78._0_8_)->in_use = true;
        (((example *)local_78._0_8_)->super_example_predict).ft_offset = priv->offset;
        std::vector<example*,std::allocator<example*>>::emplace_back<example*>
                  ((vector<example*,std::allocator<example*>> *)&tmp,(example **)&local_78);
        priv->total_examples_generated = priv->total_examples_generated + 1;
        uVar8 = priv->learn_ec_ref_cnt;
      }
      this_00 = LEARNER::as_multiline<char,char>(priv->base_learner);
      LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
                (this_00,&tmp,(long)iVar6);
      for (uVar8 = uVar11; uVar8 < priv->learn_ec_ref_cnt; uVar8 = (ulong)((int)uVar8 + 1)) {
        priv->learn_ec_ref[uVar8].super_example_predict.ft_offset = local_80;
      }
      std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base
                (&tmp.super__Vector_base<example_*,_std::allocator<example_*>_>);
    }
    if (add_conditioning) {
      for (; uVar11 < priv->learn_ec_ref_cnt; uVar11 = (ulong)((int)uVar11 + 1)) {
        del_example_conditioning(priv,priv->learn_ec_ref + uVar11);
      }
    }
  }
  return;
}

Assistant:

void generate_training_example(search_private& priv, polylabel& losses, float weight, bool add_conditioning = true,
    float min_loss = FLT_MAX)  // min_loss = FLT_MAX means "please compute it for me as the actual min"; any other value
                               // means to use this
{
  // should we really subtract out min-loss?
  // float min_loss = FLT_MAX;
  if (priv.cb_learner)
  {
    if (min_loss == FLT_MAX)
      for (size_t i = 0; i < losses.cb.costs.size(); i++) min_loss = MIN(min_loss, losses.cb.costs[i].cost);
    for (size_t i = 0; i < losses.cb.costs.size(); i++) losses.cb.costs[i].cost = losses.cb.costs[i].cost - min_loss;
  }
  else
  {
    if (min_loss == FLT_MAX)
      for (size_t i = 0; i < losses.cs.costs.size(); i++) min_loss = MIN(min_loss, losses.cs.costs[i].x);
    for (size_t i = 0; i < losses.cs.costs.size(); i++)
      losses.cs.costs[i].x = (losses.cs.costs[i].x - min_loss) * weight;
  }
  // cerr << "losses = ["; for (size_t i=0; i<losses.cs.costs.size(); i++) cerr << ' ' << losses.cs.costs[i].class_index
  // << ':' << losses.cs.costs[i].x; cerr << " ]" << endl;

  if (!priv.is_ldf)  // not LDF
  {
    // since we're not LDF, it should be the case that ec_ref_cnt == 1
    // and learn_ec_ref[0] is a pointer to a single example
    assert(priv.learn_ec_ref_cnt == 1);
    assert(priv.learn_ec_ref != nullptr);

    example& ec = priv.learn_ec_ref[0];
    polylabel old_label = ec.l;
    ec.l = losses;  // labels;
    if (add_conditioning)
      add_example_conditioning(priv, ec, priv.learn_condition_on.size(), priv.learn_condition_on_names.begin(),
          priv.learn_condition_on_act.begin());
    for (size_t is_local = 0; is_local <= (size_t)priv.xv; is_local++)
    {
      int learner = select_learner(priv, priv.current_policy, priv.learn_learner_id, true, is_local > 0);
      ec.in_use = true;
      cdbg << "BEGIN base_learner->learn(ec, " << learner << ")" << endl;
      as_singleline(priv.base_learner)->learn(ec, learner);
      cdbg << "END   base_learner->learn(ec, " << learner << ")" << endl;
    }
    if (add_conditioning)
      del_example_conditioning(priv, ec);
    ec.l = old_label;
    priv.total_examples_generated++;
  }
  else  // is  LDF
  {
    assert(cs_get_costs_size(priv.cb_learner, losses) == priv.learn_ec_ref_cnt);
    size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(priv.learn_ec_ref[0])) ? 1 : 0;

    // TODO: weight
    if (add_conditioning)
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        add_example_conditioning(priv, ec, priv.learn_condition_on.size(), priv.learn_condition_on_names.begin(),
            priv.learn_condition_on_act.begin());
      }

    for (size_t is_local = 0; is_local <= (size_t)priv.xv; is_local++)
    {
      int learner = select_learner(priv, priv.current_policy, priv.learn_learner_id, true, is_local > 0);

      // create an example collection for

      multi_ex tmp;
      uint64_t tmp_offset = 0;
      if (priv.learn_ec_ref_cnt > start_K)
        tmp_offset = priv.learn_ec_ref[start_K].ft_offset;
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        CS::label& lab = ec.l.cs;
        if (lab.costs.size() == 0)
        {
          CS::wclass wc = {0., a - (uint32_t)start_K, 0., 0.};
          lab.costs.push_back(wc);
        }
        lab.costs[0].x = losses.cs.costs[a - start_K].x;
        ec.in_use = true;
        // store the offset to restore it later
        ec.ft_offset = priv.offset;
        // create the example collection used to learn
        tmp.push_back(&ec);
        cdbg << "generate_training_example called learn on action a=" << a << ", costs.size=" << lab.costs.size()
             << " ec=" << &ec << endl;
        priv.total_examples_generated++;
      }

      // learn with the multiline example
      as_multiline(priv.base_learner)->learn(tmp, learner);

      // restore the offsets in examples
      int i = 0;
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++, i++)
        priv.learn_ec_ref[a].ft_offset = tmp_offset;
    }

    if (add_conditioning)
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        del_example_conditioning(priv, ec);
      }
  }
}